

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c++
# Opt level: O2

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,ArrayPtr<const_unsigned_char> s)

{
  uint uVar1;
  ulong uVar2;
  uint h;
  ulong uVar3;
  byte *pbVar4;
  
  uVar3 = s.size_;
  pbVar4 = s.ptr;
  uVar2 = uVar3 & 0xffffffff;
  do {
    uVar1 = (uint)uVar2;
    switch(uVar3 & 0xffffffff) {
    case 3:
      uVar1 = uVar1 ^ (uint)pbVar4[2] << 0x10;
    case 2:
      uVar1 = uVar1 ^ (uint)pbVar4[1] << 8;
    case 1:
      uVar1 = (*pbVar4 ^ uVar1) * 0x5bd1e995;
    case 0:
      uVar1 = (uVar1 >> 0xd ^ uVar1) * 0x5bd1e995;
      return uVar1 >> 0xf ^ uVar1;
    default:
      uVar2 = (ulong)(uVar1 * 0x5bd1e995 ^
                     ((uint)(*(int *)pbVar4 * 0x5bd1e995) >> 0x18 ^ *(int *)pbVar4 * 0x5bd1e995) *
                     0x5bd1e995);
      pbVar4 = pbVar4 + 4;
      uVar3 = (ulong)((int)uVar3 - 4);
    }
  } while( true );
}

Assistant:

uint HashCoder::operator*(ArrayPtr<const byte> s) const {
  // murmur2 adapted from libc++ source code.
  //
  // TODO(perf): Use CityHash or FarmHash on 64-bit machines? They seem optimized for x86-64; what
  //   about ARM? Ask Vlad for advice.

  constexpr uint m = 0x5bd1e995;
  constexpr uint r = 24;
  uint h = s.size();
  const byte* data = s.begin();
  uint len = s.size();
  for (; len >= 4; data += 4, len -= 4) {
    uint k;
    memcpy(&k, data, sizeof(k));
    k *= m;
    k ^= k >> r;
    k *= m;
    h *= m;
    h ^= k;
  }
  switch (len) {
  case 3:
    h ^= data[2] << 16;
    KJ_FALLTHROUGH;
  case 2:
    h ^= data[1] << 8;
    KJ_FALLTHROUGH;
  case 1:
    h ^= data[0];
    h *= m;
  }
  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;
  return h;
}